

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O1

void __thiscall
JointPolicyPureVector::JointPolicyPureVector
          (JointPolicyPureVector *this,Interface_ProblemToPolicyDiscretePure *pu)

{
  PolicyDomainCategory PVar1;
  
  PVar1 = (*(pu->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[8]
          )(pu);
  JointPolicyDiscretePure::JointPolicyDiscretePure(&this->super_JointPolicyDiscretePure,pu,PVar1);
  PVar1 = (*(pu->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[8]
          )(pu);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            (&this->super_JPolComponent_VectorImplementation,pu,PVar1,999999);
  (this->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
  _vptr_JointPolicy = (_func_int **)&PTR_operator__005af190;
  (this->super_JPolComponent_VectorImplementation)._vptr_JPolComponent_VectorImplementation =
       (_func_int **)&DAT_005af250;
  (this->_m_indivPols_PolicyPureVector).
  super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_indivPols_PolicyPureVector).
  super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_indivPols_PolicyPureVector).
  super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

JointPolicyPureVector(const Interface_ProblemToPolicyDiscretePure* pu)
          :
          JointPolicyDiscretePure( pu , pu->GetDefaultIndexDomCat()  ),
          JPolComponent_VectorImplementation(pu,  pu->GetDefaultIndexDomCat() )
        {}